

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_time(mg_session *session,mg_time **time)

{
  int iVar1;
  mg_time *pmVar2;
  undefined8 *in_RSI;
  mg_session *in_RDI;
  int64_t *unaff_retaddr;
  mg_session *in_stack_00000008;
  int status;
  mg_time *time_tmp;
  int status_1;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 uVar3;
  uint8_t in_stack_ffffffffffffffd6;
  undefined1 uVar4;
  uint8_t in_stack_ffffffffffffffd7;
  undefined1 uVar5;
  mg_session *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mg_session_check_struct_header
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd6
                      );
  if (local_4 == 0) {
    pmVar2 = mg_time_alloc((mg_allocator *)in_stack_ffffffffffffffd8);
    if (pmVar2 == (mg_time *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      local_4 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(in_stack_00000008,unaff_retaddr);
      uVar3 = (undefined2)iVar1;
      uVar4 = (undefined1)((uint)iVar1 >> 0x10);
      uVar5 = (undefined1)((uint)iVar1 >> 0x18);
      if (iVar1 == 0) {
        iVar1 = mg_session_read_integer(in_stack_00000008,unaff_retaddr);
        uVar3 = (undefined2)iVar1;
        uVar4 = (undefined1)((uint)iVar1 >> 0x10);
        uVar5 = (undefined1)((uint)iVar1 >> 0x18);
        if (iVar1 == 0) {
          *in_RSI = pmVar2;
          return 0;
        }
      }
      mg_allocator_free((mg_allocator *)
                        CONCAT17(uVar5,CONCAT16(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffd0))),
                        in_stack_ffffffffffffffc8);
      local_4 = CONCAT13(uVar5,CONCAT12(uVar4,uVar3));
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_time(mg_session *session, mg_time **time) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 2), MG_SIGNATURE_TIME));
  mg_time *time_tmp = mg_time_alloc(session->decoder_allocator);
  if (!time_tmp) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;
  status = mg_session_read_integer(session, &time_tmp->nanoseconds);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &time_tmp->tz_offset_seconds);
  if (status != 0) {
    goto cleanup;
  }

  *time = time_tmp;
  return 0;

cleanup:
  mg_allocator_free(session->decoder_allocator, time_tmp);
  return status;
}